

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

TryEmplaceResult * __thiscall
QHash<std::pair<QString,QString>,QString>::tryEmplace_impl<std::pair<QString,QString>const&>
          (TryEmplaceResult *__return_storage_ptr__,void *this,pair<QString,_QString> *key)

{
  uchar uVar1;
  uint *puVar2;
  Span *pSVar3;
  Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *pDVar4;
  QHashMultiReturnType<QString,_QString> hash;
  Node<std::pair<QString,_QString>,_QString> *this_00;
  long in_FS_OFFSET;
  bool bVar7;
  Bucket BVar8;
  QHash<std::pair<QString,_QString>,_QString> local_40;
  long local_38;
  Span *pSVar5;
  ulong uVar6;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*this == 0) {
    pDVar4 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::detached
                       ((Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *)0x0);
    *(Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> **)this = pDVar4;
  }
  local_40.d = (Data *)0x0;
  hash = qHashMulti<QString,QString>(*(size_t *)(*this + 0x18),&key->first,&key->second);
  BVar8 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,QString>,QString>>::
          findBucketWithHash<std::pair<QString,QString>>(*this,key,hash);
  uVar6 = BVar8.index;
  pSVar5 = BVar8.span;
  uVar1 = pSVar5->offsets[uVar6];
  puVar2 = *this;
  if ((puVar2 == (uint *)0x0) || (1 < *puVar2)) {
LAB_002877f1:
    QHash<std::pair<QString,_QString>,_QString>::operator=
              (&local_40,(QHash<std::pair<QString,_QString>,_QString> *)this);
    if (uVar1 == 0xff) {
      bVar7 = *(ulong *)(*this + 0x10) >> 1 <= *(ulong *)(*this + 8);
    }
    else {
      bVar7 = false;
    }
    pDVar4 = *this;
    pSVar3 = pDVar4->spans;
    if (bVar7) {
      pDVar4 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::
               detached(pDVar4,pDVar4->size + 1);
    }
    else {
      pDVar4 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::
               detached(pDVar4);
    }
    *(Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> **)this = pDVar4;
    if (bVar7) {
      BVar8 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,QString>,QString>>::
              findBucketWithHash<std::pair<QString,QString>>
                        ((Data<QHashPrivate::Node<std::pair<QString,QString>,QString>> *)pDVar4,key,
                         hash);
    }
    else {
      BVar8.index._0_4_ = (uint)BVar8.index & 0x7f;
      BVar8.span = pDVar4->spans +
                   ((((ulong)((long)pSVar5 - (long)pSVar3) >> 4) * 0x1c71c71c71c71c80 | uVar6) >> 7)
      ;
      BVar8.index._4_4_ = 0;
    }
  }
  else {
    if (uVar1 != 0xff) goto LAB_002878dd;
    if (*(ulong *)(puVar2 + 4) >> 1 <= *(ulong *)(puVar2 + 2)) goto LAB_002877f1;
  }
  if (uVar1 == 0xff) {
    this_00 = QHashPrivate::Span<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::insert
                        (BVar8.span,BVar8.index);
    std::pair<QString,_QString>::pair(&this_00->key,key);
    (this_00->value).d.d = (Data *)0x0;
    (this_00->value).d.ptr = (char16_t *)0x0;
    (this_00->value).d.size = 0;
    *(long *)(*this + 8) = *(long *)(*this + 8) + 1;
  }
LAB_002878dd:
  pSVar5 = (*this)->spans;
  (__return_storage_ptr__->iterator).i.d = *this;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar8.span - (long)pSVar5) >> 4) * 0x1c71c71c71c71c80 | BVar8.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<std::pair<QString,_QString>,_QString>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }